

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::FaceForward<1>::doExpand
          (FaceForward<1> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  ExprP<float> local_80 [2];
  float local_5c;
  ExprP<float> local_58;
  ExprP<float> local_48;
  ExprP<bool> local_38;
  ExprP<float> *local_28;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  FaceForward<1> *this_local;
  
  local_28 = in_RCX;
  args_local = args;
  param_1_local = param_1;
  this_local = this;
  dot((Functions *)&local_48,in_RCX + 2,in_RCX + 1);
  local_5c = 0.0;
  constant<float>((shaderexecutor *)&local_58,&local_5c);
  shaderexecutor::operator<((shaderexecutor *)&local_38,&local_48,&local_58);
  shaderexecutor::operator-((shaderexecutor *)local_80,local_28);
  cond<float>((shaderexecutor *)this,&local_38,local_28,local_80);
  ExprP<float>::~ExprP(local_80);
  ExprP<bool>::~ExprP(&local_38);
  ExprP<float>::~ExprP(&local_58);
  ExprP<float>::~ExprP(&local_48);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return cond(dot(args.c, args.b) < constant(0.0f), args.a, -args.a);
	}